

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queueTest.cpp
# Opt level: O1

void print<ft::queue<int,ft::deque<int,ft::allocator<int>>>>
               (queue<int,_ft::deque<int,_ft::allocator<int>_>_> *t,char *s)

{
  size_type *psVar1;
  map_pointer ppvVar2;
  long lVar3;
  size_t sVar4;
  ostream *this;
  pointer pvVar5;
  char local_29;
  
  lVar3 = std::cout;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar3 + -0x18) + 0x10c098);
  }
  else {
    sVar4 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  if ((t->c).m_size != 0) {
    do {
      local_29 = ' ';
      this = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_29,1);
      std::ostream::operator<<(this,*(t->c).m_start.m_cur);
      pvVar5 = (t->c).m_start.m_cur + 1;
      (t->c).m_start.m_cur = pvVar5;
      if (pvVar5 == (t->c).m_start.m_last) {
        ppvVar2 = (t->c).m_start.m_node;
        (t->c).m_start.m_node = ppvVar2 + 1;
        pvVar5 = ppvVar2[1];
        (t->c).m_start.m_first = pvVar5;
        (t->c).m_start.m_last = pvVar5 + 0x40;
        (t->c).m_start.m_cur = pvVar5;
      }
      psVar1 = &(t->c).m_size;
      *psVar1 = *psVar1 - 1;
    } while (*psVar1 != 0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.front();
		t.pop();
	}
	std::cout << std::endl;
}